

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O3

void av1_calc_proj_params_sse4_1
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar7;
  undefined1 auVar6 [16];
  long lVar8;
  undefined1 in_XMM1 [16];
  long lVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar17;
  int iVar18;
  undefined1 in_XMM3 [16];
  undefined1 auVar15 [16];
  int iVar19;
  undefined1 auVar16 [16];
  long lVar20;
  undefined1 auVar21 [16];
  long lVar25;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      return;
    }
    if (height < 1) {
      auVar26 = (undefined1  [16])0x0;
      lVar5 = 0;
      lVar7 = 0;
    }
    else {
      lVar5 = 0;
      lVar7 = 0;
      uVar3 = 0;
      auVar26 = (undefined1  [16])0x0;
      do {
        if (0 < width) {
          lVar20 = 0;
          do {
            auVar24 = pmovzxbd(in_XMM3,*(undefined4 *)(dat8 + lVar20));
            auVar15 = pmovzxbd(in_XMM1,*(undefined4 *)(src8 + lVar20));
            piVar1 = flt1 + lVar20;
            auVar22._0_4_ = *piVar1 + auVar24._0_4_ * -0x10;
            auVar22._4_4_ = piVar1[1] + auVar24._4_4_ * -0x10;
            auVar22._8_4_ = piVar1[2] + auVar24._8_4_ * -0x10;
            auVar22._12_4_ = piVar1[3] + auVar24._12_4_ * -0x10;
            auVar29._0_4_ = (auVar15._0_4_ - auVar24._0_4_) * 0x10;
            auVar29._4_4_ = (auVar15._4_4_ - auVar24._4_4_) * 0x10;
            auVar29._8_4_ = (auVar15._8_4_ - auVar24._8_4_) * 0x10;
            auVar29._12_4_ = (auVar15._12_4_ - auVar24._12_4_) * 0x10;
            auVar15 = pmuldq(auVar22,auVar22);
            in_XMM3._0_8_ = auVar15._0_8_ + lVar5;
            in_XMM3._8_8_ = auVar15._8_8_ + lVar7;
            auVar15._4_4_ = auVar22._4_4_;
            auVar15._0_4_ = auVar22._4_4_;
            auVar15._8_4_ = auVar22._12_4_;
            auVar15._12_4_ = auVar22._12_4_;
            auVar22 = pmuldq(auVar22,auVar29);
            auVar24._4_4_ = 0;
            auVar24._0_4_ = auVar29._4_4_;
            auVar24._8_8_ = auVar29._8_8_ >> 0x20;
            auVar29 = pmuldq(auVar24,auVar15);
            auVar15 = pmuldq(auVar15,auVar15);
            lVar5 = auVar15._0_8_ + in_XMM3._0_8_;
            lVar7 = auVar15._8_8_ + in_XMM3._8_8_;
            in_XMM1._0_8_ = auVar29._0_8_ + auVar22._0_8_ + auVar26._0_8_;
            in_XMM1._8_8_ = auVar29._8_8_ + auVar22._8_8_ + auVar26._8_8_;
            lVar20 = lVar20 + 4;
            auVar26 = in_XMM1;
          } while (lVar20 < width);
        }
        uVar3 = uVar3 + 1;
        flt1 = flt1 + flt1_stride;
        src8 = src8 + src_stride;
        dat8 = dat8 + dat_stride;
        in_XMM1 = auVar26;
      } while (uVar3 != (uint)height);
    }
    *C = 0;
    C[1] = auVar26._8_8_ + auVar26._0_8_;
    H[1][0] = 0;
    H[1][1] = lVar7 + lVar5;
    lVar20 = (long)(height * width);
    H[1][1] = (lVar7 + lVar5) / lVar20;
  }
  else {
    if (params->r[1] < 1) {
      if (height < 1) {
        auVar26 = (undefined1  [16])0x0;
        lVar5 = 0;
        lVar7 = 0;
      }
      else {
        lVar5 = 0;
        lVar7 = 0;
        uVar3 = 0;
        auVar26 = (undefined1  [16])0x0;
        do {
          if (0 < width) {
            lVar20 = 0;
            do {
              auVar29 = pmovzxbd(in_XMM3,*(undefined4 *)(dat8 + lVar20));
              auVar15 = pmovzxbd(in_XMM1,*(undefined4 *)(src8 + lVar20));
              piVar1 = flt0 + lVar20;
              auVar23._0_4_ = *piVar1 + auVar29._0_4_ * -0x10;
              auVar23._4_4_ = piVar1[1] + auVar29._4_4_ * -0x10;
              auVar23._8_4_ = piVar1[2] + auVar29._8_4_ * -0x10;
              auVar23._12_4_ = piVar1[3] + auVar29._12_4_ * -0x10;
              auVar9._0_4_ = (auVar15._0_4_ - auVar29._0_4_) * 0x10;
              auVar9._4_4_ = (auVar15._4_4_ - auVar29._4_4_) * 0x10;
              auVar9._8_4_ = (auVar15._8_4_ - auVar29._8_4_) * 0x10;
              auVar9._12_4_ = (auVar15._12_4_ - auVar29._12_4_) * 0x10;
              auVar15 = pmuldq(auVar23,auVar23);
              in_XMM3._0_8_ = auVar15._0_8_ + lVar5;
              in_XMM3._8_8_ = auVar15._8_8_ + lVar7;
              auVar6._4_4_ = auVar23._4_4_;
              auVar6._0_4_ = auVar23._4_4_;
              auVar6._8_4_ = auVar23._12_4_;
              auVar6._12_4_ = auVar23._12_4_;
              auVar24 = pmuldq(auVar23,auVar9);
              auVar10._4_4_ = 0;
              auVar10._0_4_ = auVar9._4_4_;
              auVar10._8_8_ = auVar9._8_8_ >> 0x20;
              auVar29 = pmuldq(auVar10,auVar6);
              auVar15 = pmuldq(auVar6,auVar6);
              lVar5 = auVar15._0_8_ + in_XMM3._0_8_;
              lVar7 = auVar15._8_8_ + in_XMM3._8_8_;
              in_XMM1._0_8_ = auVar29._0_8_ + auVar24._0_8_ + auVar26._0_8_;
              in_XMM1._8_8_ = auVar29._8_8_ + auVar24._8_8_ + auVar26._8_8_;
              lVar20 = lVar20 + 4;
              auVar26 = in_XMM1;
            } while (lVar20 < width);
          }
          uVar3 = uVar3 + 1;
          flt0 = flt0 + flt0_stride;
          src8 = src8 + src_stride;
          dat8 = dat8 + dat_stride;
          in_XMM1 = auVar26;
        } while (uVar3 != (uint)height);
      }
      *C = auVar26._8_8_ + auVar26._0_8_;
      C[1] = 0;
      (*H)[0] = lVar7 + lVar5;
      (*H)[1] = 0;
      lVar20 = (long)(height * width);
      (*H)[0] = (lVar7 + lVar5) / lVar20;
      goto LAB_00427b85;
    }
    if (height < 1) {
      lVar20 = 0;
      lVar25 = 0;
      auVar26 = (undefined1  [16])0x0;
      lVar5 = 0;
      lVar7 = 0;
      lVar12 = 0;
      lVar13 = 0;
      lVar8 = 0;
      lVar11 = 0;
    }
    else {
      lVar8 = 0;
      lVar11 = 0;
      uVar3 = 0;
      lVar12 = 0;
      lVar13 = 0;
      lVar5 = 0;
      lVar7 = 0;
      auVar26 = (undefined1  [16])0x0;
      lVar20 = 0;
      lVar25 = 0;
      do {
        if (0 < width) {
          lVar4 = 0;
          do {
            auVar15 = pmovzxbd(in_XMM3,*(undefined4 *)(dat8 + lVar4));
            auVar29 = pmovzxbd(in_XMM8,*(undefined4 *)(src8 + lVar4));
            piVar1 = flt0 + lVar4;
            piVar2 = flt1 + lVar4;
            iVar14 = auVar15._0_4_;
            iVar17 = auVar15._4_4_;
            iVar18 = auVar15._8_4_;
            iVar19 = auVar15._12_4_;
            in_XMM8._0_4_ = (auVar29._0_4_ - iVar14) * 0x10;
            in_XMM8._4_4_ = (auVar29._4_4_ - iVar17) * 0x10;
            in_XMM8._8_4_ = (auVar29._8_4_ - iVar18) * 0x10;
            in_XMM8._12_4_ = (auVar29._12_4_ - iVar19) * 0x10;
            auVar30._0_4_ = *piVar1 + iVar14 * -0x10;
            auVar30._4_4_ = piVar1[1] + iVar17 * -0x10;
            auVar30._8_4_ = piVar1[2] + iVar18 * -0x10;
            auVar30._12_4_ = piVar1[3] + iVar19 * -0x10;
            auVar28._0_4_ = *piVar2 + iVar14 * -0x10;
            auVar28._4_4_ = piVar2[1] + iVar17 * -0x10;
            auVar28._8_4_ = piVar2[2] + iVar18 * -0x10;
            auVar28._12_4_ = piVar2[3] + iVar19 * -0x10;
            auVar29 = pmuldq(auVar30,auVar30);
            auVar16._4_4_ = auVar30._4_4_;
            auVar16._0_4_ = auVar30._4_4_;
            auVar16._8_4_ = auVar30._12_4_;
            auVar16._12_4_ = auVar30._12_4_;
            auVar15 = pmuldq(auVar16,auVar16);
            lVar8 = auVar15._0_8_ + auVar29._0_8_ + lVar8;
            lVar11 = auVar15._8_8_ + auVar29._8_8_ + lVar11;
            auVar29 = pmuldq(auVar28,auVar30);
            auVar21._4_4_ = auVar28._4_4_;
            auVar21._0_4_ = auVar28._4_4_;
            auVar21._8_4_ = auVar28._12_4_;
            auVar21._12_4_ = auVar28._12_4_;
            auVar15 = pmuldq(auVar21,auVar16);
            lVar12 = auVar15._0_8_ + auVar29._0_8_ + lVar12;
            lVar13 = auVar15._8_8_ + auVar29._8_8_ + lVar13;
            auVar29 = pmuldq(auVar28,auVar28);
            auVar15 = pmuldq(auVar21,auVar21);
            lVar5 = auVar15._0_8_ + auVar29._0_8_ + lVar5;
            lVar7 = auVar15._8_8_ + auVar29._8_8_ + lVar7;
            auVar29 = pmuldq(auVar30,in_XMM8);
            auVar27._4_4_ = in_XMM8._4_4_;
            auVar27._0_4_ = in_XMM8._4_4_;
            auVar27._8_4_ = in_XMM8._12_4_;
            auVar27._12_4_ = in_XMM8._12_4_;
            auVar15 = pmuldq(auVar16,auVar27);
            in_XMM3._0_8_ = auVar15._0_8_ + auVar29._0_8_ + auVar26._0_8_;
            in_XMM3._8_8_ = auVar15._8_8_ + auVar29._8_8_ + auVar26._8_8_;
            auVar15 = pmuldq(auVar28,in_XMM8);
            auVar26 = pmuldq(auVar21,auVar27);
            lVar20 = auVar26._0_8_ + auVar15._0_8_ + lVar20;
            lVar25 = auVar26._8_8_ + auVar15._8_8_ + lVar25;
            lVar4 = lVar4 + 4;
            auVar26 = in_XMM3;
          } while (lVar4 < width);
        }
        uVar3 = uVar3 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        src8 = src8 + src_stride;
        dat8 = dat8 + dat_stride;
        in_XMM3 = auVar26;
      } while (uVar3 != (uint)height);
    }
    *C = auVar26._8_8_ + auVar26._0_8_;
    C[1] = lVar25 + lVar20;
    lVar20 = (long)(height * width);
    (*H)[0] = (lVar11 + lVar8) / lVar20;
    lVar8 = (lVar13 + lVar12) / lVar20;
    (*H)[1] = lVar8;
    H[1][1] = (lVar7 + lVar5) / lVar20;
    H[1][0] = lVar8;
    *C = *C / lVar20;
  }
  C = C + 1;
LAB_00427b85:
  *C = *C / lVar20;
  return;
}

Assistant:

void av1_calc_proj_params_sse4_1(const uint8_t *src8, int width, int height,
                                 int src_stride, const uint8_t *dat8,
                                 int dat_stride, int32_t *flt0, int flt0_stride,
                                 int32_t *flt1, int flt1_stride,
                                 int64_t H[2][2], int64_t C[2],
                                 const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_sse4_1(src8, width, height, src_stride, dat8,
                                  dat_stride, flt0, flt0_stride, flt1,
                                  flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_sse4_1(src8, width, height, src_stride, dat8,
                               dat_stride, flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_sse4_1(src8, width, height, src_stride, dat8,
                               dat_stride, flt1, flt1_stride, H, C);
  }
}